

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void sprite_evaluation(uint16_t scanline,uint16_t dot,uint8_t sprite_size)

{
  byte bVar1;
  uint8_t y_cord;
  _Bool _Var2;
  _Bool _Var3;
  _Bool in_range;
  uint8_t orig_oam_data;
  uint8_t sprite_size_local;
  uint16_t dot_local;
  uint16_t scanline_local;
  
  if (dot == 0x41) {
    sprite_overflow = false;
    secondary_overflow = false;
    primary_overflow = false;
    set_secondary_OAM_address('\0');
  }
  _Var2 = is_odd_cycle(dot);
  y_cord = oam_data;
  if (_Var2) {
    oam_data = primary_OAM[primary_OAM_addr];
  }
  else {
    _Var2 = is_OAM_overflow();
    if (_Var2) {
      oam_data = secondary_OAM[secondary_OAM_addr];
    }
    else {
      secondary_OAM[secondary_OAM_addr] = oam_data;
    }
    if (sprite_evaluation::bytes_left_to_copy == '\0') {
      _Var2 = sprite_in_range(scanline,y_cord,sprite_size);
      if (dot == 0x42) {
        sprite0_on_next_scanline = _Var2;
      }
      if ((!_Var2) || (_Var3 = is_OAM_overflow(), _Var3)) {
        if ((overflow_detection & 1U) == 0) {
          primary_OAM_addr = primary_OAM_addr + 4 & 0xfc;
          if (primary_OAM_addr == 0) {
            primary_overflow = true;
          }
        }
        else if ((_Var2) && ((primary_overflow & 1U) == 0)) {
          sprite_overflow = true;
          overflow_detection = false;
        }
        else {
          bVar1 = primary_OAM_addr + 4 & 0xfc;
          primary_OAM_addr = bVar1 | primary_OAM_addr + 1 & 3;
          if (bVar1 == 0) {
            primary_overflow = true;
          }
        }
      }
      else {
        sprite_evaluation::bytes_left_to_copy = '\x03';
        increment_OAM_addresses();
      }
    }
    else {
      sprite_evaluation::bytes_left_to_copy = sprite_evaluation::bytes_left_to_copy + 0xff;
      increment_OAM_addresses();
    }
  }
  return;
}

Assistant:

void sprite_evaluation(uint16_t scanline, uint16_t dot, uint8_t sprite_size) {
    static uint8_t bytes_left_to_copy = 0;

    if(dot == 65) {
        primary_overflow = secondary_overflow = sprite_overflow = false;
        set_secondary_OAM_address(0);
    }
    if(is_odd_cycle(dot)) {
        oam_data = primary_OAM[primary_OAM_addr];
        return;
    }

    uint8_t const orig_oam_data = oam_data;

    if(!is_OAM_overflow())
        secondary_OAM[secondary_OAM_addr] = oam_data;
    else
        oam_data = secondary_OAM[secondary_OAM_addr];

    if(bytes_left_to_copy > 0) {
        bytes_left_to_copy--;
        increment_OAM_addresses();
        return;
    }

    bool const in_range = sprite_in_range(scanline, orig_oam_data, sprite_size);

    if(dot == 66)
        sprite0_on_next_scanline = in_range;

    if(in_range && !is_OAM_overflow()) {
        bytes_left_to_copy = 3;
        increment_OAM_addresses();
        return;
    }

    if(!overflow_detection) {
        primary_OAM_addr = (primary_OAM_addr + 4) & 0xFC;
        if(primary_OAM_addr == 0)
            primary_overflow = true;
    }
    else {
        if(in_range && !primary_overflow) {
            sprite_overflow = true;
            overflow_detection = false;
        }
        else {
            primary_OAM_addr = ((primary_OAM_addr + 4) & 0xFC) | ((primary_OAM_addr + 1) & 0x3);
            if((primary_OAM_addr & 0xFC) == 0)
                primary_overflow = true;
        }
    }
}